

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cc
# Opt level: O1

void __thiscall
TlbImport::load(TlbImport *this,istream *stream,config_set *config,Registry *registry)

{
  xmlNodePtr node;
  xmlChar *pxVar1;
  _Link_type p_Var2;
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  long lVar6;
  iterator iVar7;
  ostream *poVar8;
  iterator iVar9;
  _Rb_tree_node_base *this_00;
  _Base_ptr p_Var10;
  byte extraout_var;
  xmlNodePtr pxVar11;
  runtime_error *this_01;
  MalformedXML *this_02;
  BadRootElement *this_03;
  xmlNodePtr pxVar12;
  long *plVar13;
  config_set *extraout_RDX;
  long *plVar14;
  iterator iVar15;
  char *pcVar16;
  _Link_type p_Var17;
  _Link_type p_Var18;
  undefined1 auVar19 [8];
  string *__return_storage_ptr__;
  _Rb_tree_node_base *p_Var20;
  bool bVar21;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar22;
  TypeMap all_types;
  string name;
  stringbuf buffer;
  string document;
  string type_file;
  _Alloc_hider local_190;
  _Base_ptr p_Stack_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  undefined1 local_170 [8];
  undefined1 local_168 [24];
  xmlNodePtr local_150;
  _xmlNode *local_148;
  _Alloc_hider local_140;
  _xmlNode *local_138;
  char local_130 [16];
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  undefined1 auStack_110 [24];
  _Alloc_hider local_f8;
  _xmlNode *p_Stack_f0;
  _Rb_tree_node_base local_e8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  _Base_ptr local_b0;
  undefined1 local_a8 [16];
  _xmlNode *local_98;
  _xmlNode *local_90;
  _xmlNode *local_78;
  _xmlNode *local_70;
  _xmlNode *local_68;
  undefined1 local_60 [32];
  
  local_70 = (_xmlNode *)local_60;
  local_68 = (_xmlNode *)0x0;
  local_60[0] = 0;
  local_78 = (_xmlNode *)registry;
  if (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) == 0) {
    do {
      local_120 = (undefined1  [8])std::ostream::_M_insert<unsigned_long>;
      local_f8._M_p = (pointer)0x0;
      p_Stack_f0 = (_xmlNode *)0x0;
      auStack_110._8_8_ = (_Link_type)0x0;
      auStack_110._16_8_ = (_Link_type)0x0;
      local_118._M_p = (pointer)0x0;
      auStack_110._0_8_ = (_Link_type)0x0;
      std::locale::locale((locale *)&local_e8);
      local_120 = (undefined1  [8])std::ios_base::Init::~Init;
      local_e8._M_parent._0_4_ = 0x18;
      local_e8._M_left = (_Base_ptr)local_c8;
      local_e8._M_right = (_Base_ptr)0x0;
      local_c8[0] = _S_red;
      std::istream::operator>>((istream *)stream,(streambuf *)local_120);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_170);
      if (local_170 != (undefined1  [8])(local_168 + 8)) {
        operator_delete((void *)local_170);
      }
      local_120 = (undefined1  [8])std::ios_base::Init::~Init;
      if ((_xmlNode *)local_e8._M_left != (_xmlNode *)local_c8) {
        operator_delete(local_e8._M_left);
      }
      local_120 = (undefined1  [8])std::ostream::_M_insert<unsigned_long>;
      std::locale::~locale((locale *)&local_e8);
      config = extraout_RDX;
    } while (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) == 0);
  }
  lVar5 = xmlParseMemory(local_70,(ulong)local_68 & 0xffffffff,config);
  if (lVar5 == 0) {
    this_02 = (MalformedXML *)__cxa_allocate_exception(0x60);
    local_120 = (undefined1  [8])auStack_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
    Parsing::MalformedXML::MalformedXML(this_02,(string *)local_120);
    __cxa_throw(this_02,&Parsing::MalformedXML::typeinfo,Typelib::ImportError::~ImportError);
  }
  local_98 = (_xmlNode *)&stack0xffffffffffffff78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  lVar6 = xmlDocGetRootElement(lVar5);
  if (lVar6 != 0) {
    iVar4 = xmlStrcmp(*(undefined8 *)(lVar6 + 0x10),"typelib");
    if (iVar4 != 0) {
      this_03 = (BadRootElement *)__cxa_allocate_exception(0xa0);
      std::__cxx11::string::string
                ((string *)local_120,*(char **)(lVar6 + 0x10),(allocator *)local_b8);
      local_170 = (undefined1  [8])(local_168 + 8);
      local_168._0_8_ = (_Base_ptr)0x7;
      local_168._8_8_ = (_Base_ptr)0x62696c65707974;
      local_190._M_p = (pointer)&local_180;
      p_Stack_188 = (_Base_ptr)0x0;
      local_180._M_allocated_capacity = local_180._M_allocated_capacity & 0xffffffffffffff00;
      Parsing::BadRootElement::BadRootElement
                (this_03,(string *)local_120,(string *)local_170,(string *)&local_190);
      __cxa_throw(this_03,&Parsing::BadRootElement::typeinfo,
                  Parsing::BadRootElement::~BadRootElement);
    }
    pxVar12 = (xmlNodePtr)local_168;
    local_168._0_8_ = local_168._0_8_ & 0xffffffff00000000;
    local_168._8_8_ = (_Base_ptr)0x0;
    local_148 = (_xmlNode *)0x0;
    local_168._16_8_ = pxVar12;
    local_150 = pxVar12;
    for (node = *(xmlNodePtr *)(lVar6 + 0x18); node != (xmlNodePtr)0x0; node = node->next) {
      __return_storage_ptr__ = (string *)&local_140;
      iVar4 = xmlStrcmp(node->name,"comment");
      if ((iVar4 != 0) && (iVar4 = xmlStrcmp(node->name,"text"), iVar4 != 0)) {
        (anonymous_namespace)::getStringAttribute_abi_cxx11_
                  (__return_storage_ptr__,(_anonymous_namespace_ *)node,(xmlNodePtr)"name",
                   (char *)pxVar12);
        pxVar1 = node->name;
        bVar21 = false;
        plVar14 = (long *)((anonymous_namespace)::node_categories + 0x10);
        pcVar16 = "alias";
        do {
          iVar4 = xmlStrcmp(pxVar1,pcVar16);
          if (iVar4 == 0) {
            __return_storage_ptr__ = (string *)plVar14[-1];
            break;
          }
          pcVar16 = (char *)*plVar14;
          plVar14 = plVar14 + 2;
          bVar21 = pcVar16 == (char *)0x0;
        } while (!bVar21);
        if (bVar21) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_b8 = (undefined1  [8])local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,"unrecognized XML node \'","");
          plVar14 = (long *)std::__cxx11::string::append(local_b8);
          local_190._M_p = (pointer)*plVar14;
          plVar13 = plVar14 + 2;
          if ((long *)local_190._M_p == plVar13) {
            local_180._M_allocated_capacity = *plVar13;
            local_180._8_8_ = plVar14[3];
            local_190._M_p = (pointer)&local_180;
          }
          else {
            local_180._M_allocated_capacity = *plVar13;
          }
          p_Stack_188 = (_Base_ptr)plVar14[1];
          *plVar14 = (long)plVar13;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_190);
          local_120 = (undefined1  [8])*plVar14;
          pxVar12 = (xmlNodePtr)(plVar14 + 2);
          if (local_120 == (undefined1  [8])pxVar12) {
            auStack_110._0_8_ = pxVar12->_private;
            auStack_110._8_8_ = plVar14[3];
            local_120 = (undefined1  [8])auStack_110;
          }
          else {
            auStack_110._0_8_ = pxVar12->_private;
          }
          local_118._M_p = (pointer)plVar14[1];
          *plVar14 = (long)pxVar12;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          std::runtime_error::runtime_error(this_01,(string *)local_120);
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                        *)local_170,(key_type *)&local_140);
        p_Var10 = (_Base_ptr)local_168;
        if (iVar7._M_node == p_Var10) {
          local_60._16_8_ = &stack0xffffffffffffffc0;
          pxVar12 = (xmlNodePtr)(local_60 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)pxVar12,local_98,
                     (char *)((long)&local_98->_private + (long)&local_90->_private));
          (anonymous_namespace)::getStringAttribute_abi_cxx11_
                    ((string *)local_120,(_anonymous_namespace_ *)node,(xmlNodePtr)"source_id",
                     (char *)p_Var10);
          std::__cxx11::string::operator=((string *)pxVar12,(string *)local_120);
          if (local_120 != (undefined1  [8])auStack_110) {
            operator_delete((void *)local_120);
          }
          anon_unknown.dwarf_18535::TypeNode::TypeNode
                    ((TypeNode *)local_120,node,(string *)&local_140,(string *)pxVar12,
                     (NodeLoader)__return_storage_ptr__);
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                  ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                                    *)local_168._8_8_,(_Link_type)local_168,(_Base_ptr)&local_140,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pxVar12);
          if (((_Link_type)iVar9._M_node == (_Link_type)local_168) ||
             (iVar4 = std::__cxx11::string::compare((string *)&local_140), iVar4 < 0)) {
            this_00 = (_Rb_tree_node_base *)operator_new(0x90);
            p_Var18 = (_Link_type)(this_00 + 1);
            *(_Base_ptr **)(this_00 + 1) = &this_00[1]._M_left;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)p_Var18,local_140._M_p,local_140._M_p + (long)&local_138->_private)
            ;
            local_190._M_p = (pointer)&local_180;
            p_Stack_188 = (_Base_ptr)0x0;
            local_180._M_allocated_capacity = local_180._M_allocated_capacity & 0xffffffffffffff00;
            local_b0 = (_Base_ptr)0x0;
            local_a8[0] = _S_red;
            pxVar12 = (xmlNodePtr)local_b8;
            local_b8 = (undefined1  [8])local_a8;
            anon_unknown.dwarf_18535::TypeNode::TypeNode
                      ((TypeNode *)(this_00 + 2),(xmlNodePtr)0x0,(string *)&local_190,
                       (string *)pxVar12,(NodeLoader)0x0);
            if (local_b8 != (undefined1  [8])local_a8) {
              operator_delete((void *)local_b8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_p != &local_180) {
              operator_delete(local_190._M_p);
            }
            if (iVar9._M_node == (_Base_ptr)local_168) {
              if ((local_148 == (_xmlNode *)0x0) ||
                 (p_Var17 = p_Var18,
                 iVar4 = std::__cxx11::string::compare((string *)&local_150->last), -1 < iVar4)) {
LAB_0010af10:
                p_Var17 = p_Var18;
                pVar22 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                         ::_M_get_insert_unique_pos
                                   ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                                     *)local_170,(key_type *)p_Var18);
              }
              else {
LAB_0010af25:
                auVar3._8_8_ = 0;
                auVar3._0_8_ = local_150;
                pVar22 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)
                         (auVar3 << 0x40);
              }
            }
            else {
              p_Var17 = (_Link_type)(iVar9._M_node + 1);
              iVar4 = std::__cxx11::string::compare((string *)p_Var18);
              if (iVar4 < 0) {
                pVar22.second = (_Rb_tree_node_base *)local_168._16_8_;
                pVar22.first = (_Rb_tree_node_base *)local_168._16_8_;
                if ((_Base_ptr)local_168._16_8_ != iVar9._M_node) {
                  p_Var10 = (_Base_ptr)std::_Rb_tree_decrement(iVar9._M_node);
                  p_Var17 = p_Var18;
                  iVar4 = std::__cxx11::string::compare((string *)(p_Var10 + 1));
                  if (-1 < iVar4) goto LAB_0010af10;
                  iVar15 = iVar9;
                  if (p_Var10->_M_right == (_Base_ptr)0x0) {
                    iVar15._M_node = (_Base_ptr)0x0;
                    iVar9._M_node = p_Var10;
                  }
LAB_0010af38:
                  pVar22.second = iVar9._M_node;
                  pVar22.first = iVar15._M_node;
                }
              }
              else {
                p_Var17 = p_Var18;
                iVar4 = std::__cxx11::string::compare((string *)(iVar9._M_node + 1));
                if (iVar4 < 0) {
                  if (local_150 == (xmlNodePtr)iVar9._M_node) goto LAB_0010af25;
                  p_Var10 = (_Base_ptr)std::_Rb_tree_increment(iVar9._M_node);
                  p_Var17 = (_Link_type)(p_Var10 + 1);
                  iVar4 = std::__cxx11::string::compare((string *)p_Var18);
                  if (iVar4 < 0) {
                    iVar15._M_node = (iVar9._M_node)->_M_right;
                    if ((iVar9._M_node)->_M_right != (_Base_ptr)0x0) {
                      iVar15._M_node = p_Var10;
                      iVar9._M_node = p_Var10;
                    }
                    goto LAB_0010af38;
                  }
                  goto LAB_0010af10;
                }
                pVar22.second = (_Rb_tree_node_base *)0x0;
                pVar22.first = iVar9._M_node;
              }
            }
            p_Var20 = pVar22.second;
            iVar9._M_node = pVar22.first;
            if (p_Var20 == (_Rb_tree_node_base *)0x0) {
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
              ::_M_destroy_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                                 *)this_00,p_Var17);
              operator_delete(this_00);
            }
            else {
              bVar21 = true;
              if ((iVar9._M_node == (_Base_ptr)0x0) && ((_Rb_tree_node_base *)local_168 != p_Var20))
              {
                std::__cxx11::string::compare((string *)p_Var18);
                bVar21 = (bool)(extraout_var >> 7);
              }
              pxVar12 = (xmlNodePtr)local_168;
              std::_Rb_tree_insert_and_rebalance
                        (bVar21,this_00,p_Var20,(_Rb_tree_node_base *)pxVar12);
              local_148 = (_xmlNode *)((long)&local_148->_private + 1);
              iVar9._M_node = this_00;
            }
          }
          *(undefined1 (*) [8])(iVar9._M_node + 2) = local_120;
          std::__cxx11::string::operator=
                    ((string *)&iVar9._M_node[2]._M_parent,(string *)&local_118);
          std::__cxx11::string::operator=((string *)&iVar9._M_node[3]._M_parent,(string *)&local_f8)
          ;
          iVar9._M_node[4]._M_parent = local_e8._M_left;
          if ((_Rb_tree_node_base *)local_f8._M_p != &local_e8) {
            operator_delete(local_f8._M_p);
          }
          if (local_118._M_p != auStack_110 + 8) {
            operator_delete(local_118._M_p);
          }
          pxVar11 = (xmlNodePtr)&stack0xffffffffffffffc0;
          auVar19 = (undefined1  [8])local_60._16_8_;
        }
        else {
          pxVar12 = (xmlNodePtr)auStack_110;
          local_120 = (undefined1  [8])pxVar12;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_120,iVar7._M_node[3]._M_parent,
                     (long)&(iVar7._M_node[3]._M_parent)->_M_color +
                     (long)&(iVar7._M_node[3]._M_left)->_M_color);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"Type ",5);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::clog,local_140._M_p,(long)local_138);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," has already been defined in ",0x1d);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(char *)local_120,(long)local_118._M_p);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::clog,"\tThe definition found in ",0x19);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::clog,(char *)local_98,(long)local_90);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," will be ignored",0x10);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          pxVar11 = (xmlNodePtr)auStack_110;
          auVar19 = local_120;
        }
        if (auVar19 != (undefined1  [8])pxVar11) {
          operator_delete((void *)auVar19);
        }
        if (local_140._M_p != local_130) {
          operator_delete(local_140._M_p);
        }
      }
    }
    p_Var18 = (_Link_type)&local_118;
    local_118._M_p = local_118._M_p & 0xffffffff00000000;
    auStack_110._0_8_ = (_Link_type)0x0;
    local_f8._M_p = (pointer)0x0;
    local_190._M_p = (pointer)0x0;
    p_Stack_188 = (_Base_ptr)0x0;
    local_180._M_allocated_capacity = (size_type)local_120;
    auStack_110._8_8_ = p_Var18;
    auStack_110._16_8_ = p_Var18;
    p_Stack_f0 = local_78;
    if ((_Base_ptr)local_168._8_8_ != (_Base_ptr)0x0) {
      auStack_110._0_8_ =
           std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>,std::_Select1st<std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>>>
           ::
           _M_copy<false,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>,std::_Select1st<std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>>>::_Reuse_or_alloc_node>
                     ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>,std::_Select1st<std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>>>
                       *)local_168._8_8_,p_Var18,(_Base_ptr)&local_190,
                      (_Reuse_or_alloc_node *)pxVar12);
      p_Var17 = (_Link_type)auStack_110._0_8_;
      do {
        auStack_110._8_8_ = p_Var17;
        p_Var17 = (_Link_type)(((_Link_type)auStack_110._8_8_)->super__Rb_tree_node_base)._M_left;
        p_Var2 = (_Link_type)auStack_110._0_8_;
      } while (p_Var17 != (_Link_type)0x0);
      do {
        auStack_110._16_8_ = p_Var2;
        p_Var2 = (_Link_type)(((_Link_type)auStack_110._16_8_)->super__Rb_tree_node_base)._M_right;
      } while (p_Var2 != (_Link_type)0x0);
      local_f8._M_p = (pointer)local_148;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                *)local_190._M_p,p_Var18);
    if ((_Rb_tree_node_base *)local_f8._M_p != (_Rb_tree_node_base *)0x0) {
      do {
        lVar6 = *(long *)((__aligned_membuf<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>
                           *)(auStack_110._8_8_ + 0x20))->_M_storage;
        local_190._M_p = (pointer)&local_180;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_190,lVar6,*(long *)(auStack_110._8_8_ + 0x28) + lVar6);
        p_Var18 = (_Link_type)&local_190;
        anon_unknown.dwarf_18535::Factory::build((Factory *)local_120,(string *)&local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_p != &local_180) {
          operator_delete(local_190._M_p);
        }
      } while ((_Rb_tree_node_base *)local_f8._M_p != (_Rb_tree_node_base *)0x0);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                *)auStack_110._0_8_,p_Var18);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                *)local_168._8_8_,p_Var18);
  }
  if (local_98 != (_xmlNode *)&stack0xffffffffffffff78) {
    operator_delete(local_98);
  }
  xmlFreeDoc(lVar5);
  if (local_70 != (_xmlNode *)local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void TlbImport::load
    ( std::istream& stream
    , utilmm::config_set const& config
    , Typelib::Registry& registry)
{
    // libXML is not really iostream-compatible :(
    // Get the whole document
    std::string document;

    while (stream.good())
    {
        std::stringbuf buffer;
        stream >> &buffer;
        document += buffer.str();
    }
    xmlDocPtr doc = xmlParseMemory(document.c_str(), document.length());
    if (!doc)
        throw Parsing::MalformedXML();

    try
    {
        // giving "" as source_id is rather counterproductive... later
        // errormessages are not informative anymore...
        parse("", doc, registry);
        xmlFreeDoc(doc);
    }
    catch(...)
    {
        xmlFreeDoc(doc);
        throw;
    }
}